

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O3

void __thiscall AST::ASTBuilder::constructListAndInsertAsChild(ASTBuilder *this)

{
  stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_> *this_00;
  iterator *piVar1;
  size_t __n;
  int iVar2;
  _Elt_pointer ppAVar3;
  string *psVar4;
  string *psVar5;
  ASTNode *this_01;
  vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> childrenToBeInserted;
  value_type B;
  vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> local_78;
  ASTNode *local_58;
  ASTNode *local_50;
  string local_48;
  
  this_00 = &this->stack;
  ppAVar3 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar3 ==
      (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar3 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_50 = ppAVar3[-1];
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back(&this_00->c);
  local_78.super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (ASTNode **)0x0;
  local_78.super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (ASTNode **)0x0;
  std::vector<AST::ASTNode*,std::allocator<AST::ASTNode*>>::_M_realloc_insert<AST::ASTNode*const&>
            ((vector<AST::ASTNode*,std::allocator<AST::ASTNode*>> *)&local_78,(iterator)0x0,
             &local_50);
  while( true ) {
    ppAVar3 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppAVar3 ==
        (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppAVar3 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    psVar4 = ASTNode::getName_abi_cxx11_(ppAVar3[-1]);
    psVar5 = ASTNode::getName_abi_cxx11_(local_50);
    __n = psVar4->_M_string_length;
    if (__n != psVar5->_M_string_length) break;
    if (__n != 0) {
      iVar2 = bcmp((psVar4->_M_dataplus)._M_p,(psVar5->_M_dataplus)._M_p,__n);
      if (iVar2 != 0) break;
    }
    ppAVar3 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppAVar3 ==
        (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppAVar3 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (local_78.super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<AST::ASTNode*,std::allocator<AST::ASTNode*>>::
      _M_realloc_insert<AST::ASTNode*const&>
                ((vector<AST::ASTNode*,std::allocator<AST::ASTNode*>> *)&local_78,
                 (iterator)
                 local_78.super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,ppAVar3 + -1);
    }
    else {
      *local_78.super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish = ppAVar3[-1];
      local_78.super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back(&this_00->c);
  }
  this_01 = (ASTNode *)operator_new(200);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"calls","");
  Calls::Calls((Calls *)this_01,&local_48,(Token *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  ASTNode::addChildToLeft(this_01,&local_78);
  ppAVar3 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58 = this_01;
  if (ppAVar3 ==
      (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<AST::ASTNode*,std::allocator<AST::ASTNode*>>::_M_push_back_aux<AST::ASTNode*>
              ((deque<AST::ASTNode*,std::allocator<AST::ASTNode*>> *)this_00,&local_58);
  }
  else {
    *ppAVar3 = this_01;
    piVar1 = &(this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  if (local_78.super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AST::ASTBuilder::constructListAndInsertAsChild() {
    auto B = stack.top();
    stack.pop();
    std::vector<ASTNode *> childrenToBeInserted;
    childrenToBeInserted.push_back(B);
    while (stack.top()->getName() == B->getName()) {
        childrenToBeInserted.push_back(stack.top());
        stack.pop();
    }

    auto A = new Calls("calls", nullptr);
    A->addChildToLeft(childrenToBeInserted);
    stack.push(A);
}